

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

Status __thiscall
soplex::SLUFactor<double>::change
          (SLUFactor<double> *this,int idx,SVectorBase<double> *subst,SSVectorBase<double> *e)

{
  CLUFactor<double> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  Nonzero<double> *pNVar6;
  Status SVar7;
  int iVar8;
  int *piVar9;
  double *pdVar10;
  long lVar11;
  Real RVar12;
  
  if (this->usetup == true) {
    if ((this->super_CLUFactor<double>).l.updateType != 1) {
      iVar8 = (this->eta).super_IdxSet.num;
      (this->eta).setupStatus = false;
      pdVar10 = (this->eta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar9 = (this->eta).super_IdxSet.idx;
LAB_001d9fd1:
      CLUFactor<double>::update(&this->super_CLUFactor<double>,idx,pdVar10,piVar9,iVar8);
      (this->eta).super_IdxSet.num = 0;
      (this->eta).setupStatus = true;
      goto LAB_001d9fe9;
    }
    iVar8 = (this->forest).super_IdxSet.num;
    (this->forest).setupStatus = false;
    pdVar10 = (this->forest).super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    piVar9 = (this->forest).super_IdxSet.idx;
  }
  else {
    this_00 = &this->super_CLUFactor<double>;
    if (e != (SSVectorBase<double> *)0x0) {
      (this->super_CLUFactor<double>).l.updateType = 0;
      CLUFactor<double>::updateNoClear
                (this_00,idx,
                 (e->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start,(e->super_IdxSet).idx,(e->super_IdxSet).num);
      (this->super_CLUFactor<double>).l.updateType = this->uptype;
      goto LAB_001d9fe9;
    }
    if ((this->super_CLUFactor<double>).l.updateType != 1) {
      pdVar4 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar4 != pdVar5) {
        memset(pdVar4,0,(long)pdVar5 - (long)pdVar4 & 0xfffffffffffffff8);
      }
      iVar8 = subst->memused;
      if (0 < (long)iVar8) {
        pNVar6 = subst->m_elem;
        lVar11 = 0;
        do {
          pdVar4[*(int *)((long)&pNVar6->idx + lVar11)] = *(double *)((long)&pNVar6->val + lVar11);
          lVar11 = lVar11 + 0x10;
        } while ((long)iVar8 * 0x10 != lVar11);
      }
      SSVectorBase<double>::clear(&this->eta);
      (this->eta).setupStatus = false;
      CLUFactor<double>::solveRight
                (this_00,(this->eta).super_VectorBase<double>.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 (this->vec).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      iVar8 = (this->eta).super_IdxSet.num;
      (this->eta).setupStatus = false;
      pdVar10 = (this->eta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar9 = (this->eta).super_IdxSet.idx;
      goto LAB_001d9fd1;
    }
    SSVectorBase<double>::clear(&this->forest);
    iVar8 = subst->memused;
    (this->forest).super_IdxSet.num = 0;
    if (0 < (long)iVar8) {
      lVar11 = 0;
      do {
        iVar2 = *(int *)((long)&subst->m_elem->idx + lVar11);
        dVar1 = *(double *)((long)&subst->m_elem->val + lVar11);
        RVar12 = Tolerances::epsilon((this->forest)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        pdVar4 = (this->forest).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (ABS(dVar1) <= RVar12) {
          pdVar4[iVar2] = 0.0;
        }
        else {
          pdVar4[iVar2] = dVar1;
          piVar9 = (this->forest).super_IdxSet.idx;
          iVar3 = (this->forest).super_IdxSet.num;
          (this->forest).super_IdxSet.num = iVar3 + 1;
          piVar9[iVar3] = iVar2;
        }
        lVar11 = lVar11 + 0x10;
      } while ((long)iVar8 * 0x10 != lVar11);
    }
    (this->forest).setupStatus = false;
    CLUFactor<double>::solveLright
              (this_00,(this->forest).super_VectorBase<double>.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    (this->forest).setupStatus = false;
    pdVar10 = (this->forest).super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar8 = 0;
    piVar9 = (int *)0x0;
  }
  CLUFactor<double>::forestUpdate(&this->super_CLUFactor<double>,idx,pdVar10,iVar8,piVar9);
  (this->forest).super_IdxSet.num = 0;
  (this->forest).setupStatus = true;
LAB_001d9fe9:
  this->usetup = false;
  (*(this->super_SLinSolver<double>)._vptr_SLinSolver[6])(this);
  SVar7 = (*(this->super_SLinSolver<double>)._vptr_SLinSolver[1])(this);
  return SVar7;
}

Assistant:

typename SLUFactor<R>::Status SLUFactor<R>::change(
   int             idx,
   const SVectorBase<R>&  subst,
   const SSVectorBase<R>* e)
{

   // BH 2005-08-23: The boolean usetup indicates that an "update VectorBase<R>"
   // has been set up. I suppose that SSVectorBase<R>  forest is this
   // update VectorBase<R>, which is set up by solveRight4update() and
   // solve2right4update() in order to optimize the basis update.

   if(usetup)
   {
      if(this->l.updateType == FOREST_TOMLIN)               // FOREST_TOMLIN updates
      {
         // BH 2005-08-19: The size of a SSVectorBase<R>  is the size of the
         // index set, i.e.  the number of nonzeros which is only
         // defined if the SSVectorBase<R>  is set up.  Since
         // SSVectorBase<R> ::altValues() calls unSetup() the size needs to be
         // stored before the following call.
         int fsize = forest.size(); // see altValues()
         this->forestUpdate(idx, forest.altValues(), fsize, forest.altIndexMem());
         forest.setSize(0);
         forest.forceSetup();
      }
      else
      {
         assert(this->l.updateType == ETA);
         changeEta(idx, eta);
      }
   }
   else if(e != nullptr)                                    // ETA updates
   {
      this->l.updateType = ETA;
      this->updateNoClear(idx, e->values(), e->indexMem(), e->size());
      this->l.updateType = uptype;
   }
   else if(this->l.updateType == FOREST_TOMLIN)             // FOREST_TOMLIN updates
   {
      assert(0);  // probably this part is never called.
      // forestUpdate() with the last parameter set to NULL should fail.
      forest = subst;
      CLUFactor<R>::solveLright(forest.altValues());
      this->forestUpdate(idx, forest.altValues(), 0, nullptr);
      forest.setSize(0);
      forest.forceSetup();
   }
   else                                               // ETA updates
   {
      assert(this->l.updateType == ETA);
      vec = subst;
      eta.clear();
      CLUFactor<R>::solveRight(eta.altValues(), vec.get_ptr());
      changeEta(idx, eta);
   }

   usetup = false;

   SPxOut::debug(this, "DSLUFA01\tupdated\t\tstability = {}\n", stability());

   return status();
}